

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O2

void __thiscall
gl3cts::TransformFeedback::CaptureGeometryInterleaved::draw
          (CaptureGeometryInterleaved *this,GLuint primitive_case)

{
  deUint32 dVar1;
  long lVar2;
  
  lVar2 = (**(code **)(**(long **)(*(long *)(&this->field_0x78 +
                                            (long)this->_vptr_CaptureGeometryInterleaved[-3]) + 8) +
                      0x18))();
  (**(code **)(lVar2 + 0x188))(0x4000);
  dVar1 = (**(code **)(lVar2 + 0x800))();
  glu::checkError(dVar1,"glClear call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0xc26);
  (**(code **)(lVar2 + 0x30))(s_geometry_interleaved_primitive_cases_xfb[primitive_case]);
  dVar1 = (**(code **)(lVar2 + 0x800))();
  glu::checkError(dVar1,"glBeginTransformFeedback call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0xc29);
  (**(code **)(lVar2 + 0x538))(0,0,1);
  dVar1 = (**(code **)(lVar2 + 0x800))();
  glu::checkError(dVar1,"glDrawArrays call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0xc2c);
  (**(code **)(lVar2 + 0x638))();
  dVar1 = (**(code **)(lVar2 + 0x800))();
  glu::checkError(dVar1,"glEndTransformFeedbac call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0xc2f);
  return;
}

Assistant:

void gl3cts::TransformFeedback::CaptureGeometryInterleaved::draw(glw::GLuint primitive_case)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.clear(GL_COLOR_BUFFER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glClear call failed.");

	gl.beginTransformFeedback(s_geometry_interleaved_primitive_cases_xfb[primitive_case]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback call failed.");

	gl.drawArrays(GL_POINTS, 0, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays call failed.");

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedbac call failed.");
}